

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void active_cb(Fl_Light_Button *i,void *v)

{
  bool bVar1;
  char cVar2;
  uint v_00;
  int iVar3;
  Fl_Widget_Type *q;
  Fl_Type *o;
  int n;
  int mod;
  void *v_local;
  Fl_Light_Button *i_local;
  
  if ((char *)v == "LOAD") {
    v_00 = Fl_Widget::active(current_widget->o);
    Fl_Button::value(&i->super_Fl_Button,v_00);
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar3 == 0) {
      Fl_Widget::activate((Fl_Widget *)i);
    }
    else {
      Fl_Widget::deactivate((Fl_Widget *)i);
    }
  }
  else {
    bVar1 = false;
    cVar2 = Fl_Button::value(&i->super_Fl_Button);
    for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
        q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
      if (((q->super_Fl_Type).selected != '\0') &&
         (iVar3 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar3 != 0)) {
        if (cVar2 == '\0') {
          Fl_Widget::deactivate(q->o);
        }
        else {
          Fl_Widget::activate(q->o);
        }
        Fl_Widget_Type::redraw(q);
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void active_cb(Fl_Light_Button* i, void* v) {
  if (v == LOAD) {
    i->value(current_widget->o->active());
    if (current_widget->is_window()) i->deactivate();
    else i->activate();
  } else {
    int mod = 0;
    int n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	n ? q->o->activate() : q->o->deactivate();
	q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}